

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IndexType.cpp
# Opt level: O1

ostream * amrex::operator<<(ostream *os,IndexType *it)

{
  ostream *poVar1;
  char local_2f;
  char local_2e [3];
  char local_2b;
  char local_2a [2];
  
  local_2f = '(';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_2f,1);
  local_2e[0] = 'N';
  if ((it->itype & 1) == 0) {
    local_2e[0] = 'C';
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2e,1);
  local_2e[1] = 0x2c;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2e + 1,1);
  local_2e[2] = 0x4e;
  if ((it->itype & 2) == 0) {
    local_2e[2] = 0x43;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2e + 2,1);
  local_2b = ',';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_2b,1);
  local_2a[0] = 'N';
  if ((it->itype & 4) == 0) {
    local_2a[0] = 'C';
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a,1);
  local_2a[1] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a + 1,1);
  std::ostream::flush();
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("operator<<(ostream&,IndexType&) failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&    os,
            const IndexType& it)
{
    os << '('
       << AMREX_D_TERM( (it.test(0)?'N':'C'),
                  << ',' << (it.test(1)?'N':'C'),
                  << ',' << (it.test(2)?'N':'C')) << ')' << std::flush;

    if (os.fail())
        amrex::Error("operator<<(ostream&,IndexType&) failed");

    return os;
}